

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O0

bool __thiscall QPlainTextEditSearchWidget::doReplace(QPlainTextEditSearchWidget *this,bool forAll)

{
  bool bVar1;
  MoveMode MVar2;
  ulong uVar3;
  bool local_d9;
  undefined1 local_c8 [4];
  int position;
  QString local_b0;
  QFlags<QRegularExpression::PatternOption> local_94;
  QString local_90;
  QRegularExpression local_78;
  undefined1 local_70 [8];
  QString text;
  int searchMode;
  QString local_40;
  QTextCursor local_28 [8];
  QTextCursor cursor;
  bool forAll_local;
  QPlainTextEditSearchWidget *this_local;
  
  uVar3 = QPlainTextEdit::isReadOnly();
  if ((uVar3 & 1) == 0) {
    QPlainTextEdit::textCursor();
    local_d9 = false;
    if (!forAll) {
      QTextCursor::selectedText();
      local_d9 = QString::isEmpty(&local_40);
      QString::~QString(&local_40);
    }
    if (local_d9 == false) {
      text.d.size._0_4_ = QComboBox::currentIndex();
      if ((int)text.d.size == 2) {
        QTextCursor::selectedText();
        QLineEdit::text();
        QFlags<QRegularExpression::PatternOption>::QFlags(&local_94,NoPatternOption);
        QRegularExpression::QRegularExpression
                  (&local_78,(QString *)&local_90,(QFlags_conflict1 *)(ulong)local_94.i);
        QLineEdit::text();
        QString::replace((QRegularExpression *)local_70,(QString *)&local_78);
        QString::~QString(&local_b0);
        QRegularExpression::~QRegularExpression(&local_78);
        QString::~QString(&local_90);
        QTextCursor::insertText((QString *)local_28);
        QString::~QString((QString *)local_70);
      }
      else {
        QLineEdit::text();
        QTextCursor::insertText((QString *)local_28);
        QString::~QString((QString *)local_c8);
      }
      if (!forAll) {
        MVar2 = QTextCursor::position();
        bVar1 = doSearch(this,true,true,true);
        if (!bVar1) {
          QTextCursor::setPosition((int)local_28,MVar2);
          QPlainTextEdit::setTextCursor(*(QTextCursor **)(this + 0x88));
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    text.d.size._4_4_ = 1;
    QTextCursor::~QTextCursor(local_28);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool QPlainTextEditSearchWidget::doReplace(bool forAll) {
    if (_textEdit->isReadOnly()) {
        return false;
    }

    QTextCursor cursor = _textEdit->textCursor();

    if (!forAll && cursor.selectedText().isEmpty()) {
        return false;
    }

    const int searchMode = ui->modeComboBox->currentIndex();
    if (searchMode == RegularExpressionMode) {
        QString text = cursor.selectedText();
        text.replace(QRegularExpression(ui->searchLineEdit->text()),
                     ui->replaceLineEdit->text());
        cursor.insertText(text);
    } else {
        cursor.insertText(ui->replaceLineEdit->text());
    }

    if (!forAll) {
        const int position = cursor.position();

        if (!doSearch(true)) {
            // restore the last cursor position if text wasn't found any more
            cursor.setPosition(position);
            _textEdit->setTextCursor(cursor);
        }
    }

    return true;
}